

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_spec_constant_default_value_pass.h
# Opt level: O3

void __thiscall
spvtools::opt::SetSpecConstantDefaultValuePass::SetSpecConstantDefaultValuePass
          (SetSpecConstantDefaultValuePass *this,SpecIdToValueBitPatternMap *default_values)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>_>_>
  local_18;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__SetSpecConstantDefaultValuePass_00b03870;
  *(undefined8 *)&(this->spec_id_to_value_str_)._M_h._M_rehash_policy = 0;
  (this->spec_id_to_value_str_)._M_h._M_buckets =
       &(this->spec_id_to_value_str_)._M_h._M_single_bucket;
  (this->spec_id_to_value_str_)._M_h._M_bucket_count = 1;
  (this->spec_id_to_value_str_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spec_id_to_value_str_)._M_h._M_element_count = 0;
  (this->spec_id_to_value_str_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_18._M_h = (__hashtable_alloc *)&this->spec_id_to_value_bit_pattern_;
  (this->spec_id_to_value_str_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spec_id_to_value_str_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_bucket_count =
       (default_values->_M_h)._M_bucket_count;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_element_count =
       (default_values->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(default_values->_M_h)._M_rehash_policy.field_0x4;
  sVar1 = (default_values->_M_h)._M_rehash_policy._M_next_resize;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy._M_max_load_factor =
       (default_values->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->spec_id_to_value_bit_pattern_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_18._M_h,&default_values->_M_h,&local_18);
  return;
}

Assistant:

explicit SetSpecConstantDefaultValuePass(
      const SpecIdToValueBitPatternMap& default_values)
      : spec_id_to_value_str_(),
        spec_id_to_value_bit_pattern_(default_values) {}